

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O1

PolicyStatus __thiscall
cmStateSnapshot::GetPolicy(cmStateSnapshot *this,PolicyID id,bool parent_scope)

{
  iterator other;
  bool bVar1;
  PointerType pSVar2;
  PointerType pBVar3;
  PointerType pPVar4;
  int iVar5;
  iterator other_00;
  iterator dir;
  PositionType p;
  PositionType e;
  iterator leaf;
  PolicyStatus local_8c;
  iterator local_88;
  cmStateSnapshot *local_70;
  iterator local_68;
  iterator local_58;
  iterator local_48;
  
  local_8c = cmPolicies::GetPolicyStatus(id);
  if (1 < local_8c - REQUIRED_IF_USED) {
    local_70 = this;
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&this->Position);
    local_88.Tree = (pSVar2->BuildSystemDirectory).Tree;
    local_88.Position = (pSVar2->BuildSystemDirectory).Position;
    do {
      if ((local_88.Tree == (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x0) ||
         ((ulong)((long)((local_88.Tree)->Data).
                        super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)((local_88.Tree)->Data).
                        super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 9) < local_88.Position)) {
        __assert_fail("dir.IsValid()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmStateSnapshot.cxx"
                      ,0xb5,
                      "cmPolicies::PolicyStatus cmStateSnapshot::GetPolicy(cmPolicies::PolicyID, bool) const"
                     );
      }
      pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                         (&local_88);
      pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                         (&pBVar3->DirectoryEnd);
      local_48.Tree = (pSVar2->Policies).Tree;
      local_48.Position = (pSVar2->Policies).Position;
      pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                         (&local_88);
      pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                         (&pBVar3->DirectoryEnd);
      other = pSVar2->PolicyRoot;
      while (bVar1 = cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::operator!=
                               (&local_48,other), bVar1) {
        if ((parent_scope & 1U) == 0) {
          pPVar4 = cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::operator->(&local_48);
          bVar1 = cmPolicies::PolicyMap::IsDefined(&pPVar4->super_PolicyMap,id);
          if (bVar1) {
            pPVar4 = cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::operator->(&local_48);
            local_8c = cmPolicies::PolicyMap::Get(&pPVar4->super_PolicyMap,id);
            iVar5 = 1;
            goto LAB_001a4674;
          }
        }
        else {
          parent_scope = false;
        }
        cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::operator++(&local_48);
      }
      pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                         (&local_88);
      local_58.Tree = (pBVar3->DirectoryEnd).Tree;
      local_58.Position = (pBVar3->DirectoryEnd).Position;
      pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_58);
      local_68.Tree = (pSVar2->DirectoryParent).Tree;
      local_68.Position = (pSVar2->DirectoryParent).Position;
      other_00.Tree = &local_70->State->SnapshotData;
      other_00.Position = 0;
      bVar1 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator==
                        (&local_68,other_00);
      iVar5 = 3;
      if (!bVar1) {
        pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_68);
        local_88.Tree = (pSVar2->BuildSystemDirectory).Tree;
        local_88.Position = (pSVar2->BuildSystemDirectory).Position;
        iVar5 = 0;
      }
LAB_001a4674:
    } while (iVar5 == 0);
  }
  return local_8c;
}

Assistant:

cmPolicies::PolicyStatus cmStateSnapshot::GetPolicy(cmPolicies::PolicyID id,
                                                    bool parent_scope) const
{
  cmPolicies::PolicyStatus status = cmPolicies::GetPolicyStatus(id);

  if (status == cmPolicies::REQUIRED_ALWAYS ||
      status == cmPolicies::REQUIRED_IF_USED) {
    return status;
  }

  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator dir =
    this->Position->BuildSystemDirectory;

  while (true) {
    assert(dir.IsValid());
    cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator leaf =
      dir->DirectoryEnd->Policies;
    cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator root =
      dir->DirectoryEnd->PolicyRoot;
    for (; leaf != root; ++leaf) {
      if (parent_scope) {
        parent_scope = false;
        continue;
      }
      if (leaf->IsDefined(id)) {
        status = leaf->Get(id);
        return status;
      }
    }
    cmStateDetail::PositionType e = dir->DirectoryEnd;
    cmStateDetail::PositionType p = e->DirectoryParent;
    if (p == this->State->SnapshotData.Root()) {
      break;
    }
    dir = p->BuildSystemDirectory;
  }
  return status;
}